

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O1

int libj1939_prepare_for_events(libj1939_cmn *cmn,int *nfds,_Bool dont_wait)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  int *piVar4;
  undefined7 in_register_00000011;
  timespec curr_time;
  timespec local_30;
  
  iVar3 = 0;
  if ((int)CONCAT71(in_register_00000011,dont_wait) == 0) {
    clock_gettime(1,&local_30);
    iVar3 = timespec_diff_ms(&cmn->next_send_time,(timespec *)&local_30);
    if (iVar3 < 0) {
      iVar3 = 0;
    }
    else if (0x7fffffff < iVar3) {
      fprintf(_stderr,"timeout too long: %ld ms",iVar3);
      iVar3 = 0x7fffffff;
    }
  }
  iVar1 = epoll_wait(cmn->epoll_fd,(epoll_event *)cmn->epoll_events,(int)cmn->epoll_events_size,
                     (int)iVar3);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    iVar1 = -4;
    if (iVar2 != 4) {
      *nfds = 0;
      return -iVar2;
    }
  }
  *nfds = iVar1;
  iVar2 = clock_gettime(1,(timespec *)&cmn->last_time);
  iVar1 = 0;
  if (iVar2 < 0) {
    libj1939_prepare_for_events_cold_1();
    iVar1 = (int)local_30.tv_sec;
  }
  return iVar1;
}

Assistant:

int libj1939_prepare_for_events(struct libj1939_cmn *cmn, int *nfds,
				bool dont_wait)
{
	int ret, timeout_ms;

	if (dont_wait)
		timeout_ms = 0;
	else
		timeout_ms = libj1939_get_timeout_ms(&cmn->next_send_time);

	ret = epoll_wait(cmn->epoll_fd, cmn->epoll_events,
			 cmn->epoll_events_size, timeout_ms);
	if (ret < 0) {
		ret = -errno;
		if (ret != -EINTR) {
			*nfds = 0;
			return ret;
		}
	}

	*nfds = ret;

	ret = clock_gettime(CLOCK_MONOTONIC, &cmn->last_time);
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to get time: %i (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}